

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O2

DatFile * __thiscall DatUnpacker::DatFile::operator<<(DatFile *this,unsigned_short value)

{
  unsigned_short value_local;
  
  std::ostream::write((char *)&this->_ofstream,(long)&value_local);
  std::ostream::flush();
  return this;
}

Assistant:

DatFile& DatFile::operator<<(unsigned short value)
    {
        if (_endianness == Endianness::Big)
        {
            value = _swap(value);
        }
        _ofstream.write((char*)&value, 2);
        _ofstream.flush();

        return *this;
    }